

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths.cpp
# Opt level: O1

QStringList *
QStandardPaths::locateAll
          (QStringList *__return_storage_ptr__,StandardLocation type,QString *fileName,
          LocateOptions options)

{
  bool bVar1;
  QString *pQVar2;
  long in_FS_OFFSET;
  QString local_88;
  QArrayDataPointer<QString> local_68;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  standardLocations((QStringList *)&local_68,type);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (local_68.size != 0) {
    pQVar2 = local_68.ptr;
    do {
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_50.a.b = L'/';
      local_50.a.a = pQVar2;
      local_50.b = fileName;
      QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
                (&local_88,&local_50);
      bVar1 = existsAsSpecified(&local_88,options);
      if (bVar1) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_88);
        QList<QString>::end(__return_storage_ptr__);
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar2 = pQVar2 + 1;
    } while (pQVar2 != local_68.ptr + local_68.size);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QStandardPaths::locateAll(StandardLocation type, const QString &fileName, LocateOptions options)
{
    const QStringList &dirs = standardLocations(type);
    QStringList result;
    for (QStringList::const_iterator dir = dirs.constBegin(); dir != dirs.constEnd(); ++dir) {
        const QString path = *dir + u'/' + fileName;
        if (existsAsSpecified(path, options))
            result.append(path);
    }
    return result;
}